

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSplit.c
# Opt level: O0

void Cec_GiaSplitClean(Vec_Ptr_t *vStack)

{
  int iVar1;
  Gia_Man_t *p;
  undefined4 local_1c;
  int i;
  Gia_Man_t *pNew;
  Vec_Ptr_t *vStack_local;
  
  for (local_1c = 0; iVar1 = Vec_PtrSize(vStack), local_1c < iVar1; local_1c = local_1c + 1) {
    p = (Gia_Man_t *)Vec_PtrEntry(vStack,local_1c);
    Gia_ManStop(p);
  }
  Vec_PtrFree(vStack);
  return;
}

Assistant:

static inline void Cec_GiaSplitClean( Vec_Ptr_t * vStack )
{
    Gia_Man_t * pNew;
    int i;
    Vec_PtrForEachEntry( Gia_Man_t *, vStack, pNew, i )
        Gia_ManStop( pNew );
    Vec_PtrFree( vStack );
}